

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_len(CrispyValue *value,Vm *vm)

{
  object_t *poVar1;
  undefined8 uVar2;
  Object *pOVar3;
  ObjString *pOVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  CrispyValue CVar7;
  Object *obj;
  Vm *vm_local;
  CrispyValue *value_local;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_10;
  
  if (value->type == OBJECT) {
    pOVar3 = (value->field_1).o_value;
    if (pOVar3->type == OBJ_STRING) {
      uVar2._0_1_ = pOVar3[1].marked;
      uVar2._1_3_ = *(undefined3 *)&pOVar3[1].field_0x1;
      uVar2._4_4_ = pOVar3[1].type;
      auVar6._8_4_ = uVar2._4_4_;
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = 0x45300000;
      CVar7 = create_number((auVar6._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      local_10 = CVar7.field_1;
      value_local._0_4_ = CVar7.type;
    }
    else if (pOVar3->type == OBJ_LIST) {
      poVar1 = pOVar3[1].next;
      auVar5._8_4_ = (int)((ulong)poVar1 >> 0x20);
      auVar5._0_8_ = poVar1;
      auVar5._12_4_ = 0x45300000;
      CVar7 = create_number((auVar5._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)poVar1) - 4503599627370496.0));
      local_10 = CVar7.field_1;
      value_local._0_4_ = CVar7.type;
    }
    else {
      vm->err_flag = true;
      pOVar4 = new_string(vm,"Value has no length",0x13);
      CVar7 = create_object(&pOVar4->object);
      local_10 = CVar7.field_1;
      value_local._0_4_ = CVar7.type;
    }
  }
  else {
    vm->err_flag = true;
    pOVar4 = new_string(vm,"Value has no length",0x13);
    CVar7 = create_object(&pOVar4->object);
    local_10 = CVar7.field_1;
    value_local._0_4_ = CVar7.type;
  }
  CVar7._4_4_ = 0;
  CVar7.type = (ValueType)value_local;
  CVar7.field_1.p_value = local_10.p_value;
  return CVar7;
}

Assistant:

CrispyValue std_len(CrispyValue *value, Vm *vm) {
    if (value->type != OBJECT) {
        vm->err_flag = true;
        // TODO include type
        return create_object((Object *) new_string(vm, "Value has no length", 19));
    }

    Object *obj = value->o_value;

    switch (obj->type) {
        case OBJ_LIST:
            return create_number(((ObjList *) obj)->content.count);
        case OBJ_STRING:
            return create_number(((ObjString *) obj)->length);
        default:
            vm->err_flag = true;
            // TODO include type
            return create_object((Object *) new_string(vm, "Value has no length", 19));
    }
}